

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test<std::__cxx11::list<int,std::allocator<int>>>
               (list<int,_std::allocator<int>_> *value,serialization_category category,
               size_t serial_size)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  list<int,_std::allocator<int>_> value_copy;
  binary_istream istream;
  fail_flag_serialization_policy local_70 [8];
  _List_node_base local_68;
  size_t local_58;
  array<std::byte,_1000UL> *local_48;
  undefined1 *local_40;
  fail_flag_serialization_policy local_38 [8];
  
  if (category != container) {
    __assert_fail("serialization_category_v<T> == category",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0xc,"void test(const T &, serialization_category, size_t) [T = std::list<int>]");
  }
  local_70[0].overflow = false;
  detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                      *)local_70,value);
  if (local_70[0].overflow == true) {
    __assert_fail("!ostream.overflow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x10,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
    ;
  }
  if (((value->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size &
      0x3fffffffffffffff) != 0x3ffffffffffffffe) {
    __assert_fail("size == get_serialized_size(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x13,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
    ;
  }
  if (serial_size != 0) {
    __assert_fail("size == serial_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x14,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
    ;
  }
  local_58 = 0;
  local_48 = &buffer;
  local_40 = &_end;
  local_38[0].overflow = false;
  local_68._M_next = &local_68;
  local_68._M_prev = &local_68;
  detail::operator>>((istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                      *)local_38,(list<int,_std::allocator<int>_> *)&local_68);
  if (local_48 != &buffer) {
    __assert_fail("ostream.data() == istream.data()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x1a,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
    ;
  }
  p_Var1 = (_List_node_base *)value;
  p_Var2 = &local_68;
  if ((value->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size == local_58) {
    do {
      p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      p_Var1 = (((list<int,_std::allocator<int>_> *)p_Var1)->
               super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.super__List_node_base.
               _M_next;
      if ((p_Var1 == (_List_node_base *)value) || (p_Var2 == &local_68)) break;
    } while (*(int *)&p_Var1[1]._M_next == *(int *)&p_Var2[1]._M_next);
    if ((p_Var1 == (_List_node_base *)value) && (p_Var2 == &local_68)) {
      local_70[0].overflow = false;
      detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                          *)local_70,value);
      p_Var2 = local_68._M_next;
      if (local_70[0].overflow != false) {
        while (p_Var2 != &local_68) {
          p_Var1 = (((_List_base<int,_std::allocator<int>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
                   super__List_node_base._M_next;
          operator_delete(p_Var2,0x18);
          p_Var2 = p_Var1;
        }
        return;
      }
      __assert_fail("ostream.overflow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                    ,0x1f,
                    "void test(const T &, serialization_category, size_t) [T = std::list<int>]");
    }
  }
  __assert_fail("value == value_copy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                ,0x1b,"void test(const T &, serialization_category, size_t) [T = std::list<int>]");
}

Assistant:

void test(T const& value, serialization_category category, size_t serial_size) {
    assert(serialization_category_v<T> == category);

    auto ostream = binary_ostream{ buffer };
    ostream << value;
    assert(!ostream.overflow);

    size_t const size = ostream.data() - buffer.data();
    assert(size == get_serialized_size(value));
    assert(size == serial_size);

    auto value_copy = T{};
    auto istream = binary_istream{ buffer };
    istream >> value_copy;

    assert(ostream.data() == istream.data());
    assert(value == value_copy);

    ostream = { buffer.data(), serial_size - 1 };
    ostream << value;
    assert(ostream.overflow);
}